

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::BaseCase::verifyMessageExists
          (BaseCase *this,MessageData *message,GLenum source,GLenum type)

{
  TestLog *pTVar1;
  TestLog *pTVar2;
  uint uVar3;
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [6];
  ios_base local_120 [264];
  
  if (type != 0x1100 && source != 0x1100) {
    pTVar2 = ((this->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
    ;
    if (((message->id).source != 0) && ((message->id).type != 0)) {
      return true;
    }
    uVar3 = (*((this->super_ErrorCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
              [2])();
    pTVar1 = (TestLog *)(local_198 + 0x10);
    local_198._0_8_ = pTVar1;
    if ((uVar3 >> 0xb & 1) == 0) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_198,"Verification accuracy is lacking without a debug context","");
      tcu::ResultCollector::addResult
                (&this->m_results,QP_TEST_RESULT_QUALITY_WARNING,(string *)local_198);
      if ((TestLog *)local_198._0_8_ != pTVar1) {
        operator_delete((void *)local_198._0_8_,local_188[0]._M_allocated_capacity + 1);
      }
      local_198._0_8_ = pTVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_198 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_198 + 8),
                 "A message was expected but none was reported. Running without a debug context",
                 0x4d);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_198,"Message was not reported as expected","");
      tcu::ResultCollector::addResult(&this->m_results,QP_TEST_RESULT_FAIL,(string *)local_198);
      if ((TestLog *)local_198._0_8_ != pTVar1) {
        operator_delete((void *)local_198._0_8_,local_188[0]._M_allocated_capacity + 1);
      }
      local_198._0_8_ = pTVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_198 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_198 + 8),"A message was expected but none was reported",0x2c);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_198 + 8));
    std::ios_base::~ios_base(local_120);
  }
  return false;
}

Assistant:

bool BaseCase::verifyMessageExists (const MessageData& message, GLenum source, GLenum type)
{
	TestLog& log = m_testCtx.getLog();

	if (source == GL_DONT_CARE || type == GL_DONT_CARE)
		return false;
	else if (message.id.source == GL_NONE || message.id.type == GL_NONE)
	{
		if (isDebugContext())
		{
			m_results.addResult(QP_TEST_RESULT_FAIL, "Message was not reported as expected");
			log << TestLog::Message << "A message was expected but none was reported" << TestLog::EndMessage;
		}
		else
		{
			m_results.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Verification accuracy is lacking without a debug context");
			log << TestLog::Message << "A message was expected but none was reported. Running without a debug context" << TestLog::EndMessage;
		}
		return false;
	}
	else
		return true;
}